

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# I2sSimulationDataGenerator.cpp
# Opt level: O0

BitState __thiscall I2sSimulationDataGenerator::GetNextFrameBit(I2sSimulationDataGenerator *this)

{
  BitState BVar1;
  uint uVar2;
  reference pvVar3;
  size_type sVar4;
  BitState bit_state;
  I2sSimulationDataGenerator *this_local;
  
  pvVar3 = std::vector<BitState,_std::allocator<BitState>_>::operator[]
                     (&this->mFrameBits,(ulong)this->mCurrentFrameBitIndex);
  BVar1 = *pvVar3;
  this->mCurrentFrameBitIndex = this->mCurrentFrameBitIndex + 1;
  uVar2 = this->mCurrentFrameBitIndex;
  sVar4 = std::vector<BitState,_std::allocator<BitState>_>::size(&this->mFrameBits);
  if (sVar4 <= uVar2) {
    this->mCurrentFrameBitIndex = 0;
  }
  return BVar1;
}

Assistant:

BitState I2sSimulationDataGenerator::GetNextFrameBit()
{
    BitState bit_state = mFrameBits[ mCurrentFrameBitIndex ];
    mCurrentFrameBitIndex++;
    if( mCurrentFrameBitIndex >= mFrameBits.size() )
        mCurrentFrameBitIndex = 0;
    return bit_state;
}